

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatIndexBuilder.cpp
# Opt level: O2

int count_bytes(uint32_t integer)

{
  int bytes;
  
  bytes = 0;
  for (; integer != 0; integer = integer >> 8) {
    bytes = bytes + 1;
  }
  return bytes;
}

Assistant:

int count_bytes(uint32_t integer) {
    int bytes = 0;
    while (integer > 0) {
        integer >>= 8;
        bytes++;
    }
    return bytes;
}